

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex.h
# Opt level: O1

bool __thiscall Complex::operator<(Complex *this,Complex *a)

{
  compare_t cVar1;
  bool bVar2;
  pair<Rational,_Rational> local_108;
  pair<Rational,_Rational> local_88;
  
  std::pair<Rational,_Rational>::pair<Rational,_Rational,_true>(&local_108,&this->_re,&this->_im);
  std::pair<Rational,_Rational>::pair<Rational,_Rational,_true>(&local_88,&a->_re,&a->_im);
  cVar1 = Rational::compare(&local_108.first,&local_88.first);
  if (cVar1 == CMP_LESS) {
    bVar2 = true;
  }
  else {
    cVar1 = Rational::compare(&local_88.first,&local_108.first);
    if (cVar1 == CMP_LESS) {
      bVar2 = false;
    }
    else {
      cVar1 = Rational::compare(&local_108.second,&local_88.second);
      bVar2 = cVar1 == CMP_LESS;
    }
  }
  if (local_88.second._denominator.digits.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.second._denominator.digits.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_88.second._numerator.digits.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.second._numerator.digits.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_88.first._denominator.digits.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.first._denominator.digits.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_88.first._numerator.digits.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.first._numerator.digits.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_108.second._denominator.digits.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.second._denominator.digits.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_108.second._numerator.digits.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.second._numerator.digits.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_108.first._denominator.digits.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.first._denominator.digits.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_108.first._numerator.digits.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.first._numerator.digits.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar2;
}

Assistant:

bool operator<(const Complex &a) const
    {
        return std::make_pair(_re, _im) < std::make_pair(a._re, a._im);
    }